

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

TimerTickResult __thiscall tonk::Connection::onDiscoTimerTick(Connection *this)

{
  bool bVar1;
  bool bVar2;
  __int_type_conflict3 _Var3;
  long *in_RDI;
  Connection *in_stack_00000040;
  basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>
  *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  TimerTickResult TVar4;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                      *)0x1a782f);
  if (bVar1) {
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x1a7846);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                        *)0x1a7852);
    if (bVar1) {
      std::
      unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
      operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x1a7869);
      std::
      unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      ::operator->((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                    *)0x1a7875);
      asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>::cancel
                (in_stack_ffffffffffffffd0);
    }
  }
  reportClose((Connection *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  bVar2 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar1 = true;
  if (!bVar2) {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)CONCAT17(1,in_stack_ffffffffffffffd8));
    bVar1 = _Var3 != 0;
  }
  if (bVar1) {
    TVar4 = TickAgain;
  }
  else {
    Shutdown(in_stack_00000040);
    if (in_RDI != (long *)0x0) {
      (**(code **)(*in_RDI + 8))();
    }
    TVar4 = StopTicking;
  }
  return TVar4;
}

Assistant:

Connection::TimerTickResult Connection::onDiscoTimerTick()
{
    // Cancel any ongoing hostname resolution to quit faster
    if (ResolverState && ResolverState->Resolver) {
        ResolverState->Resolver->cancel();
    }

    // It is safe to report OnClose() to the application here because all of
    // the strand work will check if disconnection has started before invoking
    // any further callbacks.
    reportClose();

    /*
        The Connection object will stay alive until the application calls
        tonk_free().  After that point this code will run periodically to
        check if it is time to free the Connection object.  Note that since
        this code is running in the Connection's strand, it is not possible
        for datagram processing (or other operations) to be going on in
        parallel.  And the application has called tonk_free() to promise
        that no more API calls will interact with the object.

        Summary- In the Connection strand:
        (1) Datagram may be pending to process
        (2) Flush may be queued
        (3) async_resolve() may be in progress

        Summary- In the Send() completion callback:
        (4) Connection::WriteAllocator.Free() from Send() completion


        Drilling into each one:

        (1) Datagram may be pending to process

        This will continue to happen until the Connection is removed from all
        of the ConnectionMaps.  After that point incoming datagrams will stop
        being assigned to this Connection.  Some may still be pending for
        processing directly after this timer tick.

        (2) Flush may be queued.

        Flush gets queued when the app calls tonk_flush(), which may happen
        immediately after this timer tick.

        (3) async_resolve() may be in progress

        Initiated connections will resolve the server hostname before sending
        the first datagram.  If the application calls tonk_close() followed by
        tonk_free() during this operation, then we should wait for it to
        complete before shutting down.

        (4) Connection::WriteAllocator.Free() from Send() completion

        Since the application is no longer sending datagrams and this timer tick
        does not cause any new datagrams to be sent, there may be some pending
        Send() callbacks that will not complete until after this timer tick.


        Design:

        A reference count in the Connection class is incremented before queuing
        all operations.  When the operation completes, the counter is decremented
        before the completion callback returns.  It is important to pay close
        attention to the lifetime of scoped objects like Locker to make sure that
        the counter is decremented after these objects go out of scope.

        This timer tick will be able to delete the object after the reference
        counter goes to zero.

        In practice this means that any asio async operation e.g.
            ->post(
        Or
            ->async_resolve(
        Or
            ->async_send_to(
        Must have all code paths covered with reference counting.
    */

    if (SelfRefCount.ObjectInUse()) {
        //Logger.Debug("Delaying Connection shutdown (object in use)");
        return TimerTickResult::TickAgain;
    }

    Shutdown();

    // Object goes out of scope here----------------------------------------
    delete this;

    return TimerTickResult::StopTicking;
}